

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

bool __thiscall
teetime::Image::loadFromMemory(Image *this,uint8 *data,size_t dataSize,char *filename)

{
  Rgba *pRVar1;
  stbi_uc *p;
  int local_38;
  int comp;
  int height;
  int width;
  char *filename_local;
  size_t dataSize_local;
  uint8 *data_local;
  Image *this_local;
  
  _height = filename;
  filename_local = (char *)dataSize;
  dataSize_local = (size_t)data;
  data_local = (uint8 *)this;
  reset(this);
  init_stb();
  comp = 0;
  local_38 = 0;
  p._4_4_ = 0;
  if ((char *)0x7ffffffe < filename_local) {
    __assert_fail("dataSize < INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/Image.cpp"
                  ,0xa6,"bool teetime::Image::loadFromMemory(const uint8 *, size_t, const char *)");
  }
  pRVar1 = (Rgba *)stbi_load_from_memory
                             ((stbi_uc *)dataSize_local,(int)filename_local,&comp,&local_38,
                              (int *)((long)&p + 4),4);
  if (pRVar1 == (Rgba *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    if (comp < 1) {
      __assert_fail("width > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/Image.cpp"
                    ,0xaa,"bool teetime::Image::loadFromMemory(const uint8 *, size_t, const char *)"
                   );
    }
    if (local_38 < 1) {
      __assert_fail("height > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/Image.cpp"
                    ,0xab,"bool teetime::Image::loadFromMemory(const uint8 *, size_t, const char *)"
                   );
    }
    if (p._4_4_ < 1) {
      __assert_fail("comp > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/Image.cpp"
                    ,0xac,"bool teetime::Image::loadFromMemory(const uint8 *, size_t, const char *)"
                   );
    }
    this->m_data = pRVar1;
    this->m_width = (long)comp;
    this->m_height = (long)local_38;
    std::__cxx11::string::operator=((string *)&this->m_filename,_height);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Image::loadFromMemory(const uint8* data, size_t dataSize, const char* filename)
{
  reset();

  init_stb();
  int width = 0;
  int height = 0;
  int comp = 0;

  assert(dataSize < INT_MAX);

  if (auto p = stbi_load_from_memory(data, static_cast<int>(dataSize), &width, &height, &comp, 4))
  {
    assert(width > 0);
    assert(height > 0);
    assert(comp > 0);

    m_data = (Image::Rgba*)p;
    m_width = width;
    m_height = height;
    m_filename = filename;

    return true;
  }

  return false;
}